

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)10,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  uVar2 = readI<(moira::Size)1>(this);
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar2 = logic<(moira::Instr)10,(moira::Size)1>(this,uVar2,local_20);
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,local_1c,uVar2);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}